

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createCompositeCompare
          (Builder *this,Decoration precision,Id value1,Id value2,bool equal)

{
  Instruction *pIVar1;
  pointer ppIVar2;
  Decoration precision_00;
  bool bVar3;
  Id IVar4;
  uint size;
  Id IVar5;
  uint uVar6;
  Op OVar7;
  Id IVar8;
  Id IVar9;
  uint uVar10;
  allocator_type local_71;
  Op local_70;
  Decoration local_6c;
  uint local_68;
  uint local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  
  IVar4 = makeBoolType(this);
  local_50 = (ulong)value1;
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[local_50];
  if (pIVar1 == (Instruction *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = pIVar1->typeId;
  }
  size = getNumTypeConstituents(this,uVar10);
  ppIVar2 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ppIVar2[uVar10]->opCode & ~OpSource) != OpTypeBool) {
    local_6c = precision;
    bVar3 = isAggregateType(this,uVar10);
    if ((!bVar3) &&
       ((this->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10]->opCode != OpTypeMatrix)) {
      __assert_fail("isAggregateType(valueType) || isMatrixType(valueType)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xd6e,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
    }
    local_58 = (ulong)value2;
    local_60 = (ulong)equal;
    local_70 = equal + OpLogicalOr;
    uVar10 = 0;
    local_68 = size;
    if ((int)size < 1) {
      local_68 = uVar10;
    }
    IVar8 = 0;
    for (; local_68 != uVar10; uVar10 = uVar10 + 1) {
      local_64 = uVar10;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,1,
                 &local_64,&local_71);
      pIVar1 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_50];
      IVar9 = 0;
      IVar5 = 0;
      if (pIVar1 != (Instruction *)0x0) {
        IVar5 = pIVar1->typeId;
      }
      IVar5 = getContainedTypeId(this,IVar5,uVar10);
      pIVar1 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_58];
      if (pIVar1 != (Instruction *)0x0) {
        IVar9 = pIVar1->typeId;
      }
      IVar9 = getContainedTypeId(this,IVar9,uVar10);
      IVar5 = createCompositeExtract
                        (this,value1,IVar5,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      IVar9 = createCompositeExtract
                        (this,value2,IVar9,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      precision_00 = local_6c;
      IVar5 = createCompositeCompare(this,local_6c,IVar5,IVar9,SUB81(local_60,0));
      if (uVar10 != 0) {
        IVar8 = createBinOp(this,local_70,IVar4,IVar8,IVar5);
        IVar5 = setPrecision(this,IVar8,precision_00);
      }
      IVar8 = IVar5;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    return IVar8;
  }
  pIVar1 = ppIVar2[value2];
  if (pIVar1 == (Instruction *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = pIVar1->typeId;
  }
  if (uVar10 == uVar6) {
    OVar7 = getMostBasicTypeClass(this,uVar10);
    if (OVar7 == OpTypeBool) {
      OVar7 = equal ^ OpLogicalNotEqual;
      precision = DecorationMax;
    }
    else if (OVar7 == OpTypeFloat) {
      OVar7 = (uint)!equal + (uint)!equal * 2 + OpFOrdEqual;
    }
    else {
      OVar7 = equal ^ OpINotEqual;
    }
    if ((this->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10]->opCode - OpTypeBool < 3) {
      IVar4 = createBinOp(this,OVar7,IVar4,value1,value2);
    }
    else {
      IVar8 = makeVectorType(this,IVar4,size);
      IVar8 = createBinOp(this,OVar7,IVar8,value1,value2);
      setPrecision(this,IVar8,precision);
      IVar4 = createUnaryOp(this,equal | OpAny,IVar4,IVar8);
    }
    IVar4 = setPrecision(this,IVar4,precision);
    return IVar4;
  }
  __assert_fail("valueType == getTypeId(value2)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0xd4c,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
}

Assistant:

Id Builder::createCompositeCompare(Decoration precision, Id value1, Id value2, bool equal)
{
    Id boolType = makeBoolType();
    Id valueType = getTypeId(value1);

    Id resultId = NoResult;

    int numConstituents = getNumTypeConstituents(valueType);

    // Scalars and Vectors

    if (isScalarType(valueType) || isVectorType(valueType)) {
        assert(valueType == getTypeId(value2));
        // These just need a single comparison, just have
        // to figure out what it is.
        Op op;
        switch (getMostBasicTypeClass(valueType)) {
        case OpTypeFloat:
            op = equal ? OpFOrdEqual : OpFUnordNotEqual;
            break;
        case OpTypeInt:
        default:
            op = equal ? OpIEqual : OpINotEqual;
            break;
        case OpTypeBool:
            op = equal ? OpLogicalEqual : OpLogicalNotEqual;
            precision = NoPrecision;
            break;
        }

        if (isScalarType(valueType)) {
            // scalar
            resultId = createBinOp(op, boolType, value1, value2);
        } else {
            // vector
            resultId = createBinOp(op, makeVectorType(boolType, numConstituents), value1, value2);
            setPrecision(resultId, precision);
            // reduce vector compares...
            resultId = createUnaryOp(equal ? OpAll : OpAny, boolType, resultId);
        }

        return setPrecision(resultId, precision);
    }

    // Only structs, arrays, and matrices should be left.
    // They share in common the reduction operation across their constituents.
    assert(isAggregateType(valueType) || isMatrixType(valueType));

    // Compare each pair of constituents
    for (int constituent = 0; constituent < numConstituents; ++constituent) {
        std::vector<unsigned> indexes(1, constituent);
        Id constituentType1 = getContainedTypeId(getTypeId(value1), constituent);
        Id constituentType2 = getContainedTypeId(getTypeId(value2), constituent);
        Id constituent1 = createCompositeExtract(value1, constituentType1, indexes);
        Id constituent2 = createCompositeExtract(value2, constituentType2, indexes);

        Id subResultId = createCompositeCompare(precision, constituent1, constituent2, equal);

        if (constituent == 0)
            resultId = subResultId;
        else
            resultId = setPrecision(createBinOp(equal ? OpLogicalAnd : OpLogicalOr, boolType, resultId, subResultId),
                                    precision);
    }

    return resultId;
}